

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintSExpression::visitDataSegment(PrintSExpression *this,DataSegment *curr)

{
  Module *pMVar1;
  Expression *pEVar2;
  pointer pcVar3;
  char *__s;
  Index IVar4;
  ostream *poVar5;
  size_t sVar6;
  pointer in_RCX;
  string_view str;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if ((curr->isPassive == false) && (curr->offset == (Expression *)0x0)) {
    return;
  }
  poVar5 = this->o;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  local_50._0_1_ = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  poVar5 = this->o;
  Colors::outputColorCode(poVar5,"\x1b[31m");
  Colors::outputColorCode(poVar5,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"data ",5);
  Colors::outputColorCode(poVar5,"\x1b[0m");
  Name::print((Name *)curr,this->o);
  local_50 = (long *)CONCAT71(local_50._1_7_,0x20);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  if (curr->isPassive != false) goto LAB_00a3b838;
  pMVar1 = this->currModule;
  if (pMVar1 == (Module *)0x0) {
LAB_00a3b784:
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"(memory ",8);
    Name::print(&curr->memory,this->o);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,") ",2);
  }
  else {
    in_RCX = (pMVar1->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (in_RCX == (pMVar1->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("!currModule || currModule->memories.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                    ,0xd48,"void wasm::PrintSExpression::visitDataSegment(DataSegment *)");
    }
    if ((pMVar1 == (Module *)0x0) ||
       (in_RCX = (pointer)(curr->memory).super_IString.str._M_str,
       in_RCX != *(pointer *)
                  ((long)(((pMVar1->memories).
                           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                         _M_t + 8))) goto LAB_00a3b784;
  }
  IVar4 = Measurer::measure(curr->offset);
  if (IVar4 < 2) {
    pEVar2 = curr->offset;
    printDebugLocation(this,pEVar2);
    Visitor<wasm::PrintSExpression,_void>::visit
              ((Visitor<wasm::PrintSExpression,_void> *)this,pEVar2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"(offset ",8);
    pEVar2 = curr->offset;
    printDebugLocation(this,pEVar2);
    Visitor<wasm::PrintSExpression,_void>::visit
              ((Visitor<wasm::PrintSExpression,_void> *)this,pEVar2);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,")",1);
  }
  local_50 = (long *)CONCAT71(local_50._1_7_,0x20);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
LAB_00a3b838:
  pcVar3 = (curr->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  str._M_str = (char *)in_RCX;
  str._M_len = (size_t)pcVar3;
  String::printEscaped
            ((String *)this->o,
             (ostream *)
             ((curr->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)pcVar3),str);
  local_50 = (long *)CONCAT71(local_50._1_7_,0x29);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  __s = this->maybeNewLine;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar6);
  }
  return;
}

Assistant:

void PrintSExpression::visitDataSegment(DataSegment* curr) {
  if (!curr->isPassive && !curr->offset) {
    // This data segment must have been created from the datacount section but
    // not parsed yet. Skip it.
    return;
  }
  doIndent(o, indent);
  o << '(';
  printMajor(o, "data ");
  curr->name.print(o);
  o << ' ';
  if (!curr->isPassive) {
    assert(!currModule || currModule->memories.size() > 0);
    if (!currModule || curr->memory != currModule->memories[0]->name) {
      o << "(memory ";
      curr->memory.print(o);
      o << ") ";
    }
    bool needExplicitOffset = Measurer{}.measure(curr->offset) > 1;
    if (needExplicitOffset) {
      o << "(offset ";
    }
    visit(curr->offset);
    if (needExplicitOffset) {
      o << ")";
    }
    o << ' ';
  }
  String::printEscaped(o, {curr->data.data(), curr->data.size()});
  o << ')' << maybeNewLine;
}